

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O2

void __thiscall IR::Print::visit(Print *this,CJump *cj)

{
  BasicBlock *pBVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  string name;
  string binop;
  string unop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  BasicBlock *local_80;
  basic_ostream<char,_std::char_traits<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar5;
  
  pBVar1 = (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
           super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<2UL,_IR::BasicBlock_*>.super__Head_base<2UL,_IR::BasicBlock_*,_false>.
           _M_head_impl;
  pBVar8 = (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
           super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
           super__Head_base<1UL,_IR::BasicBlock_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"==",(allocator<char> *)&local_a0);
  pBVar7 = pBVar1;
  if (this->nextBlock_ ==
      (cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
      super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
      super__Tuple_impl<1UL,_IR::BasicBlock_*,_IR::BasicBlock_*>.
      super__Head_base<1UL,_IR::BasicBlock_*,_false>._M_head_impl) {
    std::__cxx11::string::assign((char *)&local_50);
    std::__cxx11::string::assign((char *)&local_70);
    pBVar7 = pBVar8;
    pBVar8 = pBVar1;
  }
  iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
             super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
             super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  if (lVar5 == 0) {
    iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
               super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
               super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[5])();
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    if (lVar5 == 0) {
      iVar4 = (*((cj->super_tuple<const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>).
                 super__Tuple_impl<0UL,_const_IR::Expr_*,_IR::BasicBlock_*,_IR::BasicBlock_*>.
                 super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[6])();
      lVar5 = CONCAT44(extraout_var_01,iVar4);
      if (lVar5 == 0) {
        __assert_fail("!\"unreachable\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                      ,0x97,"virtual void IR::Print::visit(IR::CJump *)");
      }
      if (fLB::FLAGS_lines == '\x01') {
        std::endl<char,std::char_traits<char>>(this->out);
        local_a0._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar5 + 8);
        fmt::v7::print<char[16],int,std::__cxx11::string&,char>
                  (this->out,(char (*) [16])"#line {0} \"{1}\"",(int *)&local_a0,
                   fLS::FLAGS_input_abi_cxx11_);
        std::endl<char,std::char_traits<char>>(this->out);
      }
      fmt::v7::print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (this->out,(char (*) [35])"\tif (yytoken() {0} {1}) goto L{2};",&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x10)
                 ,&pBVar8->index);
      std::endl<char,std::char_traits<char>>(this->out);
    }
    else {
      if ((fLB::FLAGS_lines == '\x01') && (*(int *)(lVar5 + 8) != 1)) {
        std::endl<char,std::char_traits<char>>(this->out);
        local_a0._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar5 + 8);
        fmt::v7::print<char[16],int,std::__cxx11::string&,char>
                  (this->out,(char (*) [16])"#line {0} \"{1}\"",(int *)&local_a0,
                   fLS::FLAGS_input_abi_cxx11_);
        std::endl<char,std::char_traits<char>>(this->out);
      }
      fmt::v7::print<char[60],std::__cxx11::string&,std::__cxx11::string_const&,int&,char>
                (this->out,
                 (char (*) [60])"\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
                 &local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x10)
                 ,&pBVar8->index);
      std::endl<char,std::char_traits<char>>(this->out);
    }
  }
  else {
    if (fLB::FLAGS_lines == '\x01') {
      std::endl<char,std::char_traits<char>>(this->out);
      fmt::v7::print<char[16],int&,std::__cxx11::string&,char>
                (this->out,(char (*) [16])"#line {0} \"{1}\"",(int *)(*(long *)(lVar5 + 8) + 0x48),
                 fLS::FLAGS_input_abi_cxx11_);
      std::endl<char,std::char_traits<char>>(this->out);
    }
    lVar5 = *(long *)(lVar5 + 8);
    if (*(char *)(lVar5 + 0x4c) == '\x01') {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_80 = pBVar7;
      local_78 = this->out;
      bVar3 = std::operator!=(fLS::FLAGS_token_type_abi_cxx11_,"int");
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)&local_a0);
        std::__cxx11::string::append((char *)&local_a0);
      }
      std::__cxx11::string::append((char *)&local_a0);
      lVar2 = *(long *)(lVar5 + 8);
      lVar5 = *(long *)(lVar5 + 0x10);
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        toupper((int)*(char *)(lVar2 + lVar6));
        std::__cxx11::string::push_back((char)&local_a0);
      }
      fmt::v7::print<char[35],std::__cxx11::string&,std::__cxx11::string,int&,char>
                (local_78,(char (*) [35])"\tif (yytoken() {0} {1}) goto L{2};",&local_70,&local_a0,
                 &pBVar8->index);
      std::__cxx11::string::~string((string *)&local_a0);
      pBVar7 = local_80;
    }
    else {
      fmt::v7::
      print<char[35],std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string&,int&,char>
                (this->out,(char (*) [35])"\tif ({0}parse_{1}({2})) goto L{3};",&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 0x28)
                 ,&pBVar8->index);
    }
    std::endl<char,std::char_traits<char>>(this->out);
  }
  if (pBVar7 != this->nextBlock_) {
    fmt::v7::print<char[12],int&,char>(this->out,(char (*) [12])"\tgoto L{0};",&pBVar7->index);
    std::endl<char,std::char_traits<char>>(this->out);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Print::visit(IR::CJump* cj) {
  IR::BasicBlock* target = cj->iftrue();
  IR::BasicBlock* cont = cj->iffalse();
  std::string unop = "";
  std::string binop = "==";

  if (nextBlock_ == cj->iftrue()) {
    std::swap(target, cont);
    unop = "!";
    binop = "!=";
  }

  if (auto name = cj->cond()->asName()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", name->sym()->line, FLAGS_input);
      out << std::endl;
    }

    const auto& id = name->sym()->name;

    if (name->sym()->isTerminal) {
      fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
                 tokenName(id), target->index);
    } else {
      fmt::print(out, "\tif ({0}parse_{1}({2})) goto L{3};", unop, id,
                 name->sym()->extra, target->index);
    }
    out << std::endl;
  } else if (auto code = cj->cond()->asCode()) {
    if (FLAGS_lines && code->line() != 1) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", code->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out,
               "\tif ({0}([&]() -> bool {{{1} return true; }})()) goto L{2};",
               unop, code->text(), target->index);

    out << std::endl;
  } else if (auto literal = cj->cond()->asCharLiteral()) {
    if (FLAGS_lines) {
      out << std::endl;
      fmt::print(out, "#line {0} \"{1}\"", literal->line(), FLAGS_input);
      out << std::endl;
    }

    fmt::print(out, "\tif (yytoken() {0} {1}) goto L{2};", binop,
               literal->value(), target->index);

    out << std::endl;
  } else {
    assert(!"unreachable");
  }

  if (cont != nextBlock_) {
    fmt::print(out, "\tgoto L{0};", cont->index);
    out << std::endl;
  }
}